

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  size_t sVar1;
  int iVar2;
  uint64_t uVar3;
  uint local_58;
  uint local_54;
  enet_checksum *checksum;
  ENetPeer *pEStack_40;
  int sentLength;
  ENetPeer *currentPeer;
  ENetProtocolHeader *header;
  uint8_t headerData [12];
  int checkForTimeouts_local;
  ENetEvent *event_local;
  ENetHost *host_local;
  
  host->continueSending = 1;
  headerData._4_4_ = checkForTimeouts;
  unique0x10000479 = event;
  do {
    if (host->continueSending == 0) {
      return 0;
    }
    host->continueSending = 0;
    for (pEStack_40 = host->peers; pEStack_40 < host->peers + host->peerCount;
        pEStack_40 = pEStack_40 + 1) {
      if ((pEStack_40->state != ENET_PEER_STATE_DISCONNECTED) &&
         (pEStack_40->state != ENET_PEER_STATE_ZOMBIE)) {
        host->headerFlags = 0;
        host->commandCount = 0;
        host->bufferCount = 1;
        host->packetSize = 4;
        if (host->checksumCallback != (ENetChecksumCallback)0x0) {
          host->packetSize = host->packetSize + 8;
        }
        if ((pEStack_40->acknowledgements).sentinel.next != &(pEStack_40->acknowledgements).sentinel
           ) {
          enet_protocol_send_acknowledgements(host,pEStack_40);
        }
        if ((((headerData._4_4_ == 0) ||
             ((pEStack_40->sentReliableCommands).sentinel.next ==
              &(pEStack_40->sentReliableCommands).sentinel)) ||
            (86399999 < host->serviceTime - pEStack_40->nextTimeout)) ||
           (iVar2 = enet_protocol_check_timeouts(host,pEStack_40,stack0xffffffffffffffe0),
           iVar2 != 1)) {
          if ((((pEStack_40->outgoingCommands).sentinel.next ==
                &(pEStack_40->outgoingCommands).sentinel) ||
              (iVar2 = enet_protocol_check_outgoing_commands(host,pEStack_40), iVar2 != 0)) &&
             ((pEStack_40->sentReliableCommands).sentinel.next ==
              &(pEStack_40->sentReliableCommands).sentinel)) {
            if (host->serviceTime - pEStack_40->lastReceiveTime < 86400000) {
              local_54 = host->serviceTime - pEStack_40->lastReceiveTime;
            }
            else {
              local_54 = pEStack_40->lastReceiveTime - host->serviceTime;
            }
            if ((pEStack_40->pingInterval <= local_54) &&
               (3 < (ulong)pEStack_40->mtu - host->packetSize)) {
              enet_peer_ping(pEStack_40);
              enet_protocol_check_outgoing_commands(host,pEStack_40);
            }
          }
          if (host->commandCount != 0) {
            host->buffers[0].data = &header;
            if ((host->headerFlags & 0x4000) == 0) {
              host->buffers[0].dataLength = 2;
            }
            else {
              header._2_2_ = htons((uint16_t)host->serviceTime);
              host->buffers[0].dataLength = 4;
            }
            if (pEStack_40->outgoingPeerID < 0xfff) {
              host->headerFlags = host->headerFlags | (ushort)pEStack_40->outgoingSessionID << 0xc;
            }
            header._0_2_ = htons(pEStack_40->outgoingPeerID | host->headerFlags);
            if (host->checksumCallback != (ENetChecksumCallback)0x0) {
              sVar1 = host->buffers[0].dataLength;
              if (pEStack_40->outgoingPeerID < 0xfff) {
                local_58 = pEStack_40->connectID;
              }
              else {
                local_58 = 0;
              }
              *(ulong *)(headerData + (sVar1 - 8)) = (ulong)local_58;
              host->buffers[0].dataLength = host->buffers[0].dataLength + 8;
              uVar3 = (*host->checksumCallback)(host->buffers,(int)host->bufferCount);
              *(uint64_t *)(headerData + (sVar1 - 8)) = uVar3;
            }
            pEStack_40->lastSendTime = host->serviceTime;
            iVar2 = enet_socket_send(host->socket,&pEStack_40->address,host->buffers,
                                     host->bufferCount);
            enet_protocol_remove_sent_unreliable_commands(pEStack_40);
            if (iVar2 < 0) {
              return -1;
            }
            host->totalSentData = iVar2 + host->totalSentData;
            pEStack_40->totalDataSent = (long)iVar2 + pEStack_40->totalDataSent;
            host->totalSentPackets = host->totalSentPackets + 1;
          }
        }
        else if ((stack0xffffffffffffffe0 != (ENetEvent *)0x0) &&
                (stack0xffffffffffffffe0->type != ENET_EVENT_TYPE_NONE)) {
          return 1;
        }
      }
    }
  } while( true );
}

Assistant:

static int enet_protocol_send_outgoing_commands(ENetHost* host, ENetEvent* event, int checkForTimeouts) {
	uint8_t headerData[sizeof(ENetProtocolHeader) + sizeof(enet_checksum)];
	ENetProtocolHeader* header = (ENetProtocolHeader*)headerData;
	ENetPeer* currentPeer;
	int sentLength;
	host->continueSending = 1;

	while (host->continueSending) {
		for (host->continueSending = 0, currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
			if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED || currentPeer->state == ENET_PEER_STATE_ZOMBIE)
				continue;

			host->headerFlags = 0;
			host->commandCount = 0;
			host->bufferCount = 1;
			host->packetSize = sizeof(ENetProtocolHeader);
			
			if (host->checksumCallback != NULL)
					host->packetSize += sizeof(enet_checksum);
				
			if (!enet_list_empty(&currentPeer->acknowledgements))
				enet_protocol_send_acknowledgements(host, currentPeer);

			if (checkForTimeouts != 0 && !enet_list_empty(&currentPeer->sentReliableCommands) && ENET_TIME_GREATER_EQUAL(host->serviceTime, currentPeer->nextTimeout) && enet_protocol_check_timeouts(host, currentPeer, event) == 1) {
				if (event != NULL && event->type != ENET_EVENT_TYPE_NONE)
					return 1;
				else
					continue;
			}

			if ((enet_list_empty(&currentPeer->outgoingCommands) || enet_protocol_check_outgoing_commands(host, currentPeer)) && enet_list_empty(&currentPeer->sentReliableCommands) && ENET_TIME_DIFFERENCE(host->serviceTime, currentPeer->lastReceiveTime) >= currentPeer->pingInterval && currentPeer->mtu - host->packetSize >= sizeof(ENetProtocolPing)) {
				enet_peer_ping(currentPeer);
				enet_protocol_check_outgoing_commands(host, currentPeer);
			}

			if (host->commandCount == 0)
				continue;

			host->buffers->data = headerData;

			if (host->headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME) {
				header->sentTime = ENET_HOST_TO_NET_16(host->serviceTime & 0xFFFF);
				host->buffers->dataLength = sizeof(ENetProtocolHeader);
			}
			else {
				host->buffers->dataLength = (size_t) & ((ENetProtocolHeader*)0)->sentTime;
			}

			if (currentPeer->outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
				host->headerFlags |= currentPeer->outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;

			header->peerID = ENET_HOST_TO_NET_16(currentPeer->outgoingPeerID | host->headerFlags);

			if (host->checksumCallback != NULL) {
				enet_checksum* checksum = (enet_checksum*)&headerData[host->buffers->dataLength];
				*checksum = currentPeer->outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer->connectID : 0;
				host->buffers->dataLength += sizeof(enet_checksum);
				*checksum = host->checksumCallback(host->buffers, host->bufferCount);
			}

			currentPeer->lastSendTime = host->serviceTime;
			sentLength = enet_socket_send(host->socket, &currentPeer->address, host->buffers, host->bufferCount);

			enet_protocol_remove_sent_unreliable_commands(currentPeer);

			if (sentLength < 0)
				return -1;

			host->totalSentData += sentLength;
			currentPeer->totalDataSent += sentLength;
			host->totalSentPackets++;
		}
	}

	return 0;
}